

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::DirectStateAccess::Textures::CopyTest::DataToString_abi_cxx11_
          (string *__return_storage_ptr__,CopyTest *this,GLuint count,GLubyte *data)

{
  string local_1e8 [32];
  stringstream local_1c8 [8];
  stringstream int_sstream;
  undefined1 local_1b8 [376];
  uint local_40;
  GLuint i;
  allocator<char> local_2a;
  undefined1 local_29;
  GLubyte *local_28;
  GLubyte *data_local;
  CopyTest *pCStack_18;
  GLuint count_local;
  CopyTest *this_local;
  string *data_str;
  
  local_29 = 0;
  local_28 = data;
  data_local._4_4_ = count;
  pCStack_18 = this;
  this_local = (CopyTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"[",&local_2a)
  ;
  std::allocator<char>::~allocator(&local_2a);
  for (local_40 = 0; local_40 < data_local._4_4_; local_40 = local_40 + 1) {
    std::__cxx11::stringstream::stringstream(local_1c8);
    std::ostream::operator<<(local_1b8,(uint)local_28[local_40]);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_1e8);
    if (local_40 + 1 < data_local._4_4_) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::stringstream::~stringstream(local_1c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CopyTest::DataToString(glw::GLuint count, const glw::GLubyte data[])
{
	std::string data_str = "[";

	for (glw::GLuint i = 0; i < count; ++i)
	{
		std::stringstream int_sstream;

		int_sstream << unsigned(data[i]);

		data_str.append(int_sstream.str());

		if (i + 1 < count)
		{
			data_str.append(", ");
		}
		else
		{
			data_str.append("]");
		}
	}

	return data_str;
}